

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildInt16x8_1Int8
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot,RegSlot src7RegSlot,RegSlot src8RegSlot)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  RegSlot local_58;
  RegSlot local_54;
  RegSlot srcRegSlots [8];
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0x1bb) {
    AssertCount = AssertCount + 1;
    srcRegSlots[6] = dstRegSlot;
    srcRegSlots[7] = offset;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x13d2,"(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToI8)",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    dstRegSlot = srcRegSlots[6];
    offset = srcRegSlots[7];
  }
  srcRegSlots[0] = src3RegSlot;
  srcRegSlots[1] = src4RegSlot;
  srcRegSlots[2] = src5RegSlot;
  srcRegSlots[3] = src6RegSlot;
  srcRegSlots[4] = src7RegSlot;
  srcRegSlots[5] = src8RegSlot;
  local_58 = src1RegSlot;
  local_54 = src2RegSlot;
  BuildSimd_1Ints(this,newOpcode,offset,TySimd128I8,&local_58,dstRegSlot,8);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildInt16x8_1Int8(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG9)
{
    AssertMsg(newOpcode == Js::OpCodeAsmJs::Simd128_IntsToI8, "Unexpected opcode for this format.");

    uint const LANES = 8;
    Js::RegSlot srcRegSlots[LANES];

    srcRegSlots[0] = src1RegSlot;
    srcRegSlots[1] = src2RegSlot;
    srcRegSlots[2] = src3RegSlot;
    srcRegSlots[3] = src4RegSlot;
    srcRegSlots[4] = src5RegSlot;
    srcRegSlots[5] = src6RegSlot;
    srcRegSlots[6] = src7RegSlot;
    srcRegSlots[7] = src8RegSlot;

    BuildSimd_1Ints(newOpcode, offset, TySimd128I8, srcRegSlots, dstRegSlot, LANES);
}